

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransferFunction.cpp
# Opt level: O3

void __thiscall
rtb::Filter::TransferFunction<double>::getBode
          (TransferFunction<double> *this,vector<double,_std::allocator<double>_> *xValues,
          vector<double,_std::allocator<double>_> *gain,
          vector<double,_std::allocator<double>_> *phase)

{
  pointer pdVar1;
  iterator iVar2;
  uint uVar3;
  double dVar4;
  double __z;
  double local_48;
  double local_40;
  double local_38;
  
  pdVar1 = (xValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((xValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_finish != pdVar1) {
    (xValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar1;
  }
  pdVar1 = (gain->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((gain->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar1) {
    (gain->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar1;
  }
  pdVar1 = (phase->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((phase->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pdVar1) {
    (phase->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdVar1;
  }
  local_48 = this->samplingFrequency_;
  dVar4 = ceil(local_48 * 0.5);
  if (1 < (uint)(long)dVar4) {
    uVar3 = 1;
    do {
      local_40 = (double)uVar3;
      iVar2._M_current =
           (xValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (xValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_38 = local_40;
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (xValues,iVar2,&local_40);
        dVar4 = local_38;
      }
      else {
        *iVar2._M_current = local_40;
        (xValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        dVar4 = local_40;
      }
      dVar4 = (6.283185307179586 / local_48) * dVar4;
      local_40 = getGainAt(this,dVar4);
      iVar2._M_current =
           (gain->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (gain->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (gain,iVar2,&local_40);
      }
      else {
        *iVar2._M_current = local_40;
        (gain->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      getResponseAt(this,dVar4);
      local_40 = carg(__z);
      local_40 = -local_40;
      iVar2._M_current =
           (phase->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (phase->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (phase,iVar2,&local_40);
      }
      else {
        *iVar2._M_current = local_40;
        (phase->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
        ._M_finish = iVar2._M_current + 1;
      }
      uVar3 = uVar3 + 1;
      local_48 = this->samplingFrequency_;
      dVar4 = ceil(local_48 * 0.5);
    } while (uVar3 < (uint)(long)dVar4);
  }
  return;
}

Assistant:

void TransferFunction<T>::getBode(std::vector<double>& xValues, std::vector<double>& gain, std::vector<double>& phase) const {

            xValues.clear();
            gain.clear();
            phase.clear();

            for (unsigned i{ 1 }; i < static_cast<unsigned>(ceil(samplingFrequency_ / 2.)); ++i) {
                double w{ 2 * M_PI / samplingFrequency_ * i };
                xValues.push_back(i);
                gain.push_back(getGainAt(w));
                phase.push_back(getPhaseAt(w));
            }
        }